

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall CExtKey::Decode(CExtKey *this,uchar *code)

{
  uint32_t uVar1;
  uchar *puVar2;
  CKey *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_ffffffffffffffc8;
  CKey *pCVar3;
  uchar *in_stack_ffffffffffffffe8;
  uchar *in_stack_fffffffffffffff0;
  CKey *this_00;
  undefined1 fCompressedIn;
  
  this_00 = *(CKey **)(in_FS_OFFSET + 0x28);
  in_RDI->fCompressed = in_RSI->fCompressed;
  *(undefined4 *)&in_RDI->field_0x1 = *(undefined4 *)&in_RSI->field_0x1;
  pCVar3 = in_RDI;
  uVar1 = ReadBE32(&in_RDI->fCompressed);
  fCompressedIn = (undefined1)((ulong)pCVar3 >> 0x38);
  *(uint32_t *)
   &(in_RDI->keydata)._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = uVar1;
  puVar2 = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffffc8);
  *(undefined8 *)puVar2 =
       *(undefined8 *)
        ((long)&(in_RSI->keydata)._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1);
  *(undefined8 *)(puVar2 + 8) = *(undefined8 *)&in_RSI[1].field_0x1;
  *(undefined8 *)(puVar2 + 0x10) =
       *(undefined8 *)
        ((long)&in_RSI[1].keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1);
  *(undefined8 *)(puVar2 + 0x18) = *(undefined8 *)&in_RSI[2].field_0x1;
  CKey::Set<unsigned_char_const*>
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)fCompressedIn);
  if (in_RDI->fCompressed == false) {
    if (*(int *)&(in_RDI->keydata)._M_t.
                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl == 0)
    {
      uVar1 = ReadLE32(&in_RDI->fCompressed);
      if (uVar1 == 0) goto LAB_00dee491;
    }
  }
  else {
LAB_00dee491:
    if (*(char *)((long)&in_RSI[2].keydata._M_t.
                         super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                         _M_head_impl + 1) == '\0') goto LAB_00dee4d7;
  }
  memset(&stack0xffffffffffffffe8,0,0x10);
  CKey::CKey(in_stack_ffffffffffffffc8);
  CKey::operator=(in_RSI,in_RDI);
  CKey::~CKey(in_stack_ffffffffffffffc8);
LAB_00dee4d7:
  if (*(CKey **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::Decode(const unsigned char code[BIP32_EXTKEY_SIZE]) {
    nDepth = code[0];
    memcpy(vchFingerprint, code+1, 4);
    nChild = ReadBE32(code+5);
    memcpy(chaincode.begin(), code+9, 32);
    key.Set(code+42, code+BIP32_EXTKEY_SIZE, true);
    if ((nDepth == 0 && (nChild != 0 || ReadLE32(vchFingerprint) != 0)) || code[41] != 0) key = CKey();
}